

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_write_key(mbedtls_rsa_context *rsa,uchar *start,uchar **p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  mbedtls_mpi T;
  
  mbedtls_mpi_init(&T);
  uVar4 = 0;
  uVar1 = mbedtls_rsa_export_crt(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T);
  if (uVar1 == 0) {
    uVar2 = mbedtls_asn1_write_mpi(p,start,&T);
    if ((int)uVar2 < 0) {
      uVar4 = 0;
      uVar1 = uVar2;
    }
    else {
      uVar4 = (ulong)uVar2;
      uVar1 = mbedtls_rsa_export_crt(rsa,(mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0);
      if ((uVar1 == 0) && (uVar1 = mbedtls_asn1_write_mpi(p,start,&T), -1 < (int)uVar1)) {
        uVar4 = (ulong)(uVar1 + uVar2);
        uVar1 = mbedtls_rsa_export_crt(rsa,&T,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
        if ((uVar1 == 0) && (uVar1 = mbedtls_asn1_write_mpi(p,start,&T), -1 < (int)uVar1)) {
          uVar4 = uVar1 + uVar4;
          uVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0
                                     ,(mbedtls_mpi *)0x0);
          if (uVar1 == 0) {
            uVar1 = mbedtls_asn1_write_mpi(p,start,&T);
            if (-1 < (int)uVar1) {
              uVar4 = uVar4 + uVar1;
              uVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
              if (uVar1 == 0) {
                uVar1 = mbedtls_asn1_write_mpi(p,start,&T);
                if (-1 < (int)uVar1) {
                  uVar4 = uVar4 + uVar1;
                  uVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                             (mbedtls_mpi *)0x0,&T,(mbedtls_mpi *)0x0);
                  if (uVar1 == 0) {
                    uVar1 = mbedtls_asn1_write_mpi(p,start,&T);
                    if (-1 < (int)uVar1) {
                      uVar4 = uVar4 + uVar1;
                      uVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                 (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&T);
                      if (uVar1 == 0) {
                        uVar1 = mbedtls_asn1_write_mpi(p,start,&T);
                        if (-1 < (int)uVar1) {
                          uVar4 = uVar4 + uVar1;
                          uVar1 = mbedtls_rsa_export(rsa,&T,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
                          if (uVar1 == 0) {
                            uVar1 = mbedtls_asn1_write_mpi(p,start,&T);
                            if (-1 < (int)uVar1) {
                              uVar4 = uVar4 + uVar1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  mbedtls_mpi_free(&T);
  if (-1 < (int)uVar1) {
    uVar2 = mbedtls_asn1_write_int(p,start,0);
    uVar1 = uVar2;
    if (-1 < (int)uVar2) {
      uVar3 = mbedtls_asn1_write_len(p,start,uVar4 + uVar2);
      uVar1 = uVar3;
      if ((-1 < (int)uVar3) && (uVar1 = mbedtls_asn1_write_tag(p,start,'0'), -1 < (int)uVar1)) {
        uVar1 = uVar3 + (int)(uVar4 + uVar2) + uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_rsa_write_key(const mbedtls_rsa_context *rsa, unsigned char *start,
                          unsigned char **p)
{
    size_t len = 0;
    int ret;

    mbedtls_mpi T; /* Temporary holding the exported parameters */

    /*
     * Export the parameters one after another to avoid simultaneous copies.
     */

    mbedtls_mpi_init(&T);

    /* Export QP */
    if ((ret = mbedtls_rsa_export_crt(rsa, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export DQ */
    if ((ret = mbedtls_rsa_export_crt(rsa, NULL, &T, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export DP */
    if ((ret = mbedtls_rsa_export_crt(rsa, &T, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export Q */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, &T, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export P */
    if ((ret = mbedtls_rsa_export(rsa, NULL, &T, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export D */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, &T, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export E */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export N */
    if ((ret = mbedtls_rsa_export(rsa, &T, NULL, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

end_of_export:

    mbedtls_mpi_free(&T);
    if (ret < 0) {
        return ret;
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_int(p, start, 0));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_len(p, start, len));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_tag(p, start,
                                                     MBEDTLS_ASN1_CONSTRUCTED |
                                                     MBEDTLS_ASN1_SEQUENCE));

    return (int) len;
}